

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

void slang::ast::GenerateBlockSymbol::fromSyntax
               (Compilation *compilation,CaseGenerateSyntax *syntax,ASTContext *context,
               uint32_t constructIndex,bool isUninstantiated,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  SourceRange sourceRange;
  SourceRange range;
  SourceRange sourceRange_00;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 uVar4;
  bool bVar5;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *this;
  iterator ppEVar6;
  TypeReferenceExpression *pTVar7;
  reference ppCVar8;
  size_t sVar9;
  Type *in_RDX;
  long in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDI;
  byte in_R8B;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *in_R9;
  iterator iVar10;
  ASTContext *unaff_retaddr;
  bitmask<slang::ast::EvalFlags> in_stack_0000000f;
  Diagnostic *diag_1;
  Diagnostic *diag;
  bool match;
  ConstantValue val;
  Expression *expr;
  size_t i;
  StandardCaseItemSyntax *sci_1;
  SourceRange currentMatchRange;
  bool currentFound;
  CaseItemSyntax *item_1;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::CaseItemSyntax> *__range2_1;
  bool warned;
  bool found;
  SourceRange matchRange;
  ConstantValue condVal;
  Type *condType;
  Expression *condExpr;
  iterator boundIt;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  ExpressionSyntax *es;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range4;
  StandardCaseItemSyntax *sci;
  CaseItemSyntax *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::CaseItemSyntax> *__range2;
  SyntaxNode *defBlock;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *in_stack_fffffffffffffc58;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_fffffffffffffc60;
  Diagnostic *this_00;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *in_stack_fffffffffffffc68;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *this_01;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffc70;
  Diagnostic *in_stack_fffffffffffffc78;
  SourceLocation in_stack_fffffffffffffc80;
  SourceLocation in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffcc0;
  SyntaxNode *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  TypeReferenceExpression *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce4;
  undefined1 in_stack_fffffffffffffce5;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  Expression *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffd10;
  Type *this_02;
  bool local_20a;
  bitmask<slang::ast::EvalFlags> local_209 [41];
  Expression *local_1e0;
  ulong local_1d8;
  undefined8 in_stack_fffffffffffffe30;
  ASTContext *in_stack_fffffffffffffe38;
  ExpressionSyntax *in_stack_fffffffffffffe50;
  SyntaxNode *this_03;
  pointer in_stack_fffffffffffffe58;
  __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
  in_stack_fffffffffffffe60;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffe68;
  bitmask<slang::ast::EvalFlags> local_171 [41];
  Type *local_148;
  Expression *local_140;
  iterator local_138;
  undefined4 local_12c;
  Diagnostic *local_128;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *psStack_120;
  SmallVectorBase<const_slang::ast::Expression_*> local_118 [2];
  ExpressionSyntax *local_d8;
  iterator local_d0;
  iterator local_c0;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_b0;
  StandardCaseItemSyntax *local_98;
  SyntaxNode *local_90;
  CaseItemSyntax **local_88;
  __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
  local_80;
  long local_78;
  SyntaxNode *local_70;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *local_28;
  byte local_1d;
  Type *local_18;
  long local_10;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar11;
  
  local_1d = in_R8B & 1;
  local_28 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)0x88e237);
  local_70 = (SyntaxNode *)0x0;
  local_78 = local_10 + 0x88;
  local_80._M_current =
       (CaseItemSyntax **)
       std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffc58);
  local_88 = (CaseItemSyntax **)
             std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::end
                       ((span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *)
                        in_stack_fffffffffffffc68);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffc60,
                       (__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffc58);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    ppCVar8 = __gnu_cxx::
              __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_80);
    local_90 = &(*ppCVar8)->super_SyntaxNode;
    if (local_90->kind == DefaultCaseItem) {
      slang::syntax::SyntaxNode::as<slang::syntax::DefaultCaseItemSyntax>(local_90);
      local_70 = not_null::operator_cast_to_SyntaxNode_
                           ((not_null<slang::syntax::SyntaxNode_*> *)0x88e452);
    }
    else {
      local_98 = slang::syntax::SyntaxNode::as<slang::syntax::StandardCaseItemSyntax>(local_90);
      local_b0 = &local_98->expressions;
      iVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                         ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x88e320);
      local_c0 = iVar10;
      iVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                         (in_stack_fffffffffffffc60);
      local_d0 = iVar10;
      while( true ) {
        bVar3 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                          ((self_type *)in_stack_fffffffffffffc60,
                           (iterator_base<slang::syntax::ExpressionSyntax_*> *)
                           in_stack_fffffffffffffc58);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        local_d8 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                   ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                                *)0x88e3cb);
        SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::push_back
                  ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)
                   in_stack_fffffffffffffc60,(ExpressionSyntax **)in_stack_fffffffffffffc58);
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                    *)in_stack_fffffffffffffc60);
      }
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_80);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x88e48f);
  this = (span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x88e4b0);
  std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::
  span<slang::SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>_&>
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  expressions_00._M_extent._M_extent_value = (size_t)in_stack_fffffffffffffe60._M_current;
  expressions_00._M_ptr = in_stack_fffffffffffffe58;
  bVar3 = Expression::bindMembershipExpressions
                    (in_stack_fffffffffffffe38,(TokenKind)((ulong)in_stack_fffffffffffffe30 >> 0x30)
                     ,SUB81((ulong)in_stack_fffffffffffffe30 >> 0x28,0),
                     SUB81((ulong)in_stack_fffffffffffffe30 >> 0x20,0),
                     SUB81((ulong)in_stack_fffffffffffffe30 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffffe30 >> 0x10,0),in_stack_fffffffffffffe50,
                     expressions_00,in_stack_fffffffffffffe68);
  if (!bVar3) {
    local_12c = 1;
    goto LAB_0088ecc3;
  }
  ppEVar6 = SmallVectorBase<const_slang::ast::Expression_*>::begin(local_118);
  local_138 = ppEVar6 + 1;
  local_140 = *ppEVar6;
  local_148 = (Type *)0x0;
  local_171[0].m_bits = '\0';
  bitmask<slang::ast::EvalFlags>::bitmask(local_171);
  ASTContext::eval(unaff_retaddr,(Expression *)in_RDI,in_stack_0000000f);
  uVar4 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x88e5ff);
  this_00 = local_128;
  this_01 = psStack_120;
  this_02 = local_18;
  if ((bool)uVar4) {
LAB_0088e67a:
    SourceRange::SourceRange((SourceRange *)this_00);
    bVar3 = false;
    bVar1 = false;
    std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::begin(this);
    std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::end(this_01);
    while( true ) {
      bVar5 = __gnu_cxx::
              operator==<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                        ((__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                          *)this_00,
                         (__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                          *)this);
      if (((bVar5 ^ 0xffU) & 1) == 0) break;
      ppCVar8 = __gnu_cxx::
                __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                ::operator*((__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                             *)&stack0xfffffffffffffe60);
      this_03 = &(*ppCVar8)->super_SyntaxNode;
      if (((SyntaxNode *)&this_03->kind)->kind == StandardCaseItem) {
        bVar5 = false;
        SourceRange::SourceRange((SourceRange *)this_00);
        slang::syntax::SyntaxNode::as<slang::syntax::StandardCaseItemSyntax>(this_03);
        local_1d8 = 0;
        while( true ) {
          uVar2 = local_1d8;
          sVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                            ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x88e799);
          if (sVar9 <= uVar2) break;
          in_stack_fffffffffffffcf0 = *local_138;
          local_209[0].m_bits = '\0';
          local_1e0 = in_stack_fffffffffffffcf0;
          local_138 = local_138 + 1;
          bitmask<slang::ast::EvalFlags>::bitmask(local_209);
          ASTContext::eval(unaff_retaddr,(Expression *)in_RDI,in_stack_0000000f);
          in_stack_fffffffffffffce7 =
               slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x88e838);
          local_20a = false;
          if ((bool)in_stack_fffffffffffffce7) {
            in_stack_fffffffffffffce5 =
                 slang::operator==((ConstantValue *)this_00,(ConstantValue *)this);
            local_20a = (bool)in_stack_fffffffffffffce5;
          }
          in_stack_fffffffffffffce6 = local_20a;
          in_stack_fffffffffffffce4 =
               slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x88e8a3);
          if (((!(bool)in_stack_fffffffffffffce4) && (local_148 != (Type *)0x0)) &&
             (local_1e0->kind == TypeReference)) {
            in_stack_fffffffffffffcd8 =
                 Expression::as<slang::ast::TypeReferenceExpression>(local_1e0);
            in_stack_fffffffffffffcd7 =
                 Type::isMatching(this_02,(Type *)CONCAT17(uVar4,in_stack_fffffffffffffd10));
            local_20a = (bool)in_stack_fffffffffffffcd7;
          }
          if ((!bVar5) && (local_20a != false)) {
            bVar5 = true;
          }
          slang::ConstantValue::~ConstantValue((ConstantValue *)0x88e989);
          local_1d8 = local_1d8 + 1;
        }
        if ((!bVar5) || (bVar3)) {
          if ((bVar5) && (!bVar1)) {
            sourceRange.endLoc = in_stack_fffffffffffffc88;
            sourceRange.startLoc = in_stack_fffffffffffffc80;
            ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc78,
                                SUB84((ulong)in_stack_fffffffffffffc90 >> 0x20,0),sourceRange);
            Diagnostic::operator<<(this_00,(ConstantValue *)this);
            range.endLoc = in_stack_fffffffffffffc88;
            range.startLoc = in_stack_fffffffffffffc80;
            Diagnostic::addNote(in_stack_fffffffffffffc78,
                                SUB84((ulong)in_stack_fffffffffffffc90 >> 0x20,0),range);
            bVar1 = true;
          }
          not_null<slang::syntax::SyntaxNode_*>::operator*
                    ((not_null<slang::syntax::SyntaxNode_*> *)0x88eb34);
          this = local_28;
          createCondGenBlock((Compilation *)
                             CONCAT17(in_stack_fffffffffffffce7,
                                      CONCAT16(in_stack_fffffffffffffce6,
                                               CONCAT15(in_stack_fffffffffffffce5,
                                                        CONCAT14(in_stack_fffffffffffffce4,
                                                                 in_stack_fffffffffffffce0)))),
                             (SyntaxNode *)in_stack_fffffffffffffcd8,
                             (ASTContext *)
                             CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                             (uint32_t)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x18,0),
                             in_stack_fffffffffffffcc0,
                             (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                             in_stack_fffffffffffffcf0);
        }
        else {
          bVar3 = true;
          pSVar11 = in_RDI;
          in_stack_fffffffffffffcc8 =
               not_null<slang::syntax::SyntaxNode_*>::operator*
                         ((not_null<slang::syntax::SyntaxNode_*> *)0x88e9f4);
          this = local_28;
          createCondGenBlock((Compilation *)
                             CONCAT17(in_stack_fffffffffffffce7,
                                      CONCAT16(in_stack_fffffffffffffce6,
                                               CONCAT15(in_stack_fffffffffffffce5,
                                                        CONCAT14(in_stack_fffffffffffffce4,
                                                                 in_stack_fffffffffffffce0)))),
                             (SyntaxNode *)in_stack_fffffffffffffcd8,
                             (ASTContext *)
                             CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                             (uint32_t)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x18,0),in_RDI,
                             (SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                             in_stack_fffffffffffffcf0);
          in_stack_fffffffffffffcc0 = in_RDI;
          in_RDI = pSVar11;
        }
      }
      __gnu_cxx::
      __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                    *)&stack0xfffffffffffffe60);
    }
    if (local_70 == (SyntaxNode *)0x0) {
      if (!bVar3) {
        sourceRange_00.endLoc = in_stack_fffffffffffffc88;
        sourceRange_00.startLoc = in_stack_fffffffffffffc80;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc78,
                            SUB84((ulong)in_stack_fffffffffffffc90 >> 0x20,0),sourceRange_00);
        Diagnostic::operator<<(this_00,(ConstantValue *)this);
      }
    }
    else {
      createCondGenBlock((Compilation *)
                         CONCAT17(in_stack_fffffffffffffce7,
                                  CONCAT16(in_stack_fffffffffffffce6,
                                           CONCAT15(in_stack_fffffffffffffce5,
                                                    CONCAT14(in_stack_fffffffffffffce4,
                                                             in_stack_fffffffffffffce0)))),
                         (SyntaxNode *)in_stack_fffffffffffffcd8,
                         (ASTContext *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0)
                         ,(uint32_t)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x18,0),in_stack_fffffffffffffcc0
                         ,(SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)
                          in_stack_fffffffffffffcf0);
    }
    local_12c = 0;
  }
  else {
    if (local_140->kind == TypeReference) {
      pTVar7 = Expression::as<slang::ast::TypeReferenceExpression>(local_140);
      local_148 = pTVar7->targetType;
      this_00 = local_128;
      this_01 = psStack_120;
      this_02 = local_18;
      goto LAB_0088e67a;
    }
    local_12c = 1;
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x88ecc3);
LAB_0088ecc3:
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x88ecd0);
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)0x88ecdd);
  return;
}

Assistant:

void GenerateBlockSymbol::fromSyntax(Compilation& compilation, const CaseGenerateSyntax& syntax,
                                     const ASTContext& context, uint32_t constructIndex,
                                     bool isUninstantiated,
                                     SmallVectorBase<GenerateBlockSymbol*>& results) {

    SmallVector<const ExpressionSyntax*> expressions;
    const SyntaxNode* defBlock = nullptr;
    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardCaseItem: {
                auto& sci = item->as<StandardCaseItemSyntax>();
                for (auto es : sci.expressions)
                    expressions.push_back(es);
                break;
            }
            case SyntaxKind::DefaultCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                defBlock = item->as<DefaultCaseItemSyntax>().clause;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    if (!Expression::bindMembershipExpressions(
            context, TokenKind::CaseKeyword, /* requireIntegral */ false,
            /* unwrapUnpacked */ false, /* allowTypeReferences */ true, /* allowValueRange */ true,
            *syntax.condition, expressions, bound)) {
        return;
    }

    auto boundIt = bound.begin();
    auto condExpr = *boundIt++;

    const Type* condType = nullptr;
    ConstantValue condVal = context.eval(*condExpr);
    if (!condVal) {
        if (condExpr->kind == ExpressionKind::TypeReference)
            condType = &condExpr->as<TypeReferenceExpression>().targetType;
        else
            return;
    }

    SourceRange matchRange;
    bool found = false;
    bool warned = false;

    for (auto item : syntax.items) {
        if (item->kind != SyntaxKind::StandardCaseItem)
            continue;

        // Check each case expression to see if it matches the condition value.
        bool currentFound = false;
        SourceRange currentMatchRange;
        auto& sci = item->as<StandardCaseItemSyntax>();
        for (size_t i = 0; i < sci.expressions.size(); i++) {
            // Have to keep incrementing the iterator here so that we stay in sync.
            auto expr = *boundIt++;
            ConstantValue val = context.eval(*expr);

            bool match = val && val == condVal;
            if (!val && condType && expr->kind == ExpressionKind::TypeReference)
                match = expr->as<TypeReferenceExpression>().targetType.isMatching(*condType);

            if (!currentFound && match) {
                currentFound = true;
                currentMatchRange = expr->sourceRange;
            }
        }

        if (currentFound && !found) {
            // This is the first match for this entire case generate.
            found = true;
            matchRange = currentMatchRange;
            createCondGenBlock(compilation, *sci.clause, context, constructIndex, isUninstantiated,
                               syntax.attributes, results);
        }
        else {
            // If we previously found a block, this block also matched, which we should warn about.
            if (currentFound && !warned) {
                auto& diag = context.addDiag(diag::CaseGenerateDup, currentMatchRange);
                diag << condVal;
                diag.addNote(diag::NotePreviousMatch, matchRange);
                warned = true;
            }

            // This block is not taken, so create it as uninstantiated.
            createCondGenBlock(compilation, *sci.clause, context, constructIndex, true,
                               syntax.attributes, results);
        }
    }

    if (defBlock) {
        // Only instantiated if no other blocks were instantiated.
        createCondGenBlock(compilation, *defBlock, context, constructIndex,
                           isUninstantiated || found, syntax.attributes, results);
    }
    else if (!found) {
        auto& diag = context.addDiag(diag::CaseGenerateNoBlock, condExpr->sourceRange);
        diag << condVal;
    }
}